

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QRegion __thiscall QDockAreaLayout::separatorRegion(QDockAreaLayout *this)

{
  bool bVar1;
  QDockAreaLayout *in_RSI;
  long lVar2;
  ulong uVar3;
  int i;
  long lVar4;
  long in_FS_OFFSET;
  QRect local_50;
  QRegion local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)this->corners = &DAT_aaaaaaaaaaaaaaaa;
  QRegion::QRegion((QRegion *)this);
  lVar4 = 0;
  do {
    uVar3 = 0xffffffffffffffff;
    lVar2 = 0;
    do {
      uVar3 = uVar3 + 1;
      if ((ulong)in_RSI->docks[lVar4].item_list.d.size <= uVar3) goto LAB_003f9361;
      bVar1 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(in_RSI->docks[lVar4].item_list.d.ptr)->widgetItem + lVar2));
      lVar2 = lVar2 + 0x28;
    } while (bVar1);
    local_50 = separatorRect(in_RSI,(int)lVar4);
    QRegion::QRegion(&local_40,&local_50,Rectangle);
    QRegion::operator|=((QRegion *)this,&local_40);
    QRegion::~QRegion(&local_40);
    QDockAreaLayoutInfo::separatorRegion((QDockAreaLayoutInfo *)&local_50);
    QRegion::operator|=((QRegion *)this,(QRegion *)&local_50);
    QRegion::~QRegion((QRegion *)&local_50);
LAB_003f9361:
    lVar4 = lVar4 + 1;
    if (lVar4 == 4) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return (QRegion)(QRegionData *)this;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

QRegion QDockAreaLayout::separatorRegion() const
{
    QRegion result;

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &dock = docks[i];
        if (dock.isEmpty())
            continue;
        result |= separatorRect(i);
        result |= dock.separatorRegion();
    }

    return result;
}